

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O2

Validator * __thiscall
CLI::Validator::operator|(Validator *__return_storage_ptr__,Validator *this,Validator *other)

{
  undefined1 uVar1;
  allocator local_59;
  anon_class_64_2_fa08d804 local_58;
  
  Validator(__return_storage_ptr__);
  ::std::__cxx11::string::string((string *)&local_58," OR ",&local_59);
  _merge_description(__return_storage_ptr__,this,other,(string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_58.f1,&this->func_);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_58.f2,&other->func_);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator|
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&__return_storage_ptr__->func_
             ,&local_58);
  const::{lambda(std::__cxx11::string&)#1}::~basic_string
            ((_lambda_std____cxx11__string___1_ *)&local_58);
  uVar1 = false;
  if (this->active_ != false) {
    uVar1 = other->active_;
  }
  __return_storage_ptr__->active_ = (bool)uVar1;
  __return_storage_ptr__->application_index_ = this->application_index_;
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE Validator Validator::operator|(const Validator &other) const {
    Validator newval;

    newval._merge_description(*this, other, " OR ");

    // Give references (will make a copy in lambda function)
    const std::function<std::string(std::string &)> &f1 = func_;
    const std::function<std::string(std::string &)> &f2 = other.func_;

    newval.func_ = [f1, f2](std::string &input) {
        std::string s1 = f1(input);
        std::string s2 = f2(input);
        if(s1.empty() || s2.empty())
            return std::string();

        return std::string("(") + s1 + ") OR (" + s2 + ")";
    };
    newval.active_ = active_ && other.active_;
    newval.application_index_ = application_index_;
    return newval;
}